

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::GlobalReplaceSubstring(string *substring,string *replacement,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  int iVar1;
  LogMessage *other;
  int iVar2;
  int iVar3;
  LogFinisher local_69;
  string tmp;
  
  if (s == (string *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&tmp,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x65c);
    other = internal::LogMessage::operator<<((LogMessage *)&tmp,"CHECK failed: s != nullptr: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage((LogMessage *)&tmp);
  }
  iVar3 = 0;
  if ((s->_M_string_length != 0) && (iVar3 = 0, substring->_M_string_length != 0)) {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    iVar3 = 0;
    iVar1 = std::__cxx11::string::find((char *)s,(ulong)(substring->_M_dataplus)._M_p,0);
    iVar2 = 0;
    while (iVar1 != -1) {
      std::__cxx11::string::append((string *)&tmp,(ulong)s,(long)iVar2);
      __first._M_current = (replacement->_M_dataplus)._M_p;
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)&tmp,__first,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(__first._M_current + replacement->_M_string_length));
      iVar2 = iVar1 + (int)substring->_M_string_length;
      iVar1 = std::__cxx11::string::find((char *)s,(ulong)(substring->_M_dataplus)._M_p,(long)iVar2)
      ;
      iVar3 = iVar3 + 1;
    }
    if (iVar3 != 0) {
      std::__cxx11::string::append((string *)&tmp,(ulong)s,(long)iVar2);
      std::__cxx11::string::swap((string *)s);
    }
    std::__cxx11::string::~string((string *)&tmp);
  }
  return iVar3;
}

Assistant:

int GlobalReplaceSubstring(const string& substring,
                           const string& replacement,
                           string* s) {
  GOOGLE_CHECK(s != nullptr);
  if (s->empty() || substring.empty())
    return 0;
  string tmp;
  int num_replacements = 0;
  int pos = 0;
  for (int match_pos = s->find(substring.data(), pos, substring.length());
       match_pos != string::npos;
       pos = match_pos + substring.length(),
           match_pos = s->find(substring.data(), pos, substring.length())) {
    ++num_replacements;
    // Append the original content before the match.
    tmp.append(*s, pos, match_pos - pos);
    // Append the replacement for the match.
    tmp.append(replacement.begin(), replacement.end());
  }
  // Append the content after the last match. If no replacements were made, the
  // original string is left untouched.
  if (num_replacements > 0) {
    tmp.append(*s, pos, s->length() - pos);
    s->swap(tmp);
  }
  return num_replacements;
}